

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * google::protobuf::anon_unknown_1::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool lower_first)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  string *psVar4;
  char cVar5;
  size_type sVar6;
  ulong unaff_R15;
  bool bVar7;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar4 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = input->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (input->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      bVar7 = pcVar3[sVar6] == '_';
      unaff_R15 = CONCAT71((int7)(unaff_R15 >> 8),bVar7);
      if (!bVar7) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      sVar6 = sVar6 + 1;
      psVar4 = (string *)(unaff_R15 & 0xffffffff);
    } while (sVar2 != sVar6);
  }
  if ((lower_first) && (__return_storage_ptr__->_M_string_length != 0)) {
    psVar4 = (string *)(__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = *(char *)&(psVar4->_M_dataplus)._M_p;
    cVar5 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar5 = cVar1;
    }
    *(char *)&(psVar4->_M_dataplus)._M_p = cVar5;
  }
  return psVar4;
}

Assistant:

std::string ToCamelCase(const std::string& input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = ToLower(result[0]);
  }

  return result;
}